

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_168b90f::HighBDConvolveHorizRSTest_Correctness_Test::TestBody
          (HighBDConvolveHorizRSTest_Correctness_Test *this)

{
  ConvolveHorizRSTestBase<unsigned_short> *in_stack_00000070;
  
  ConvolveHorizRSTestBase<unsigned_short>::CorrectnessTest(in_stack_00000070);
  return;
}

Assistant:

TEST_P(HighBDConvolveHorizRSTest, Correctness) { CorrectnessTest(); }